

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void init_src_var_info_of_4x4_sub_blocks
               (AV1_COMP *cpi,Block4x4VarInfo *src_var_info_of_4x4_sub_blocks,BLOCK_SIZE sb_size)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  byte in_DL;
  long in_RSI;
  AV1_COMP *in_RDI;
  int i;
  int mi_count_in_sb;
  int local_1c;
  
  _Var3 = is_src_var_for_4x4_sub_blocks_caching_enabled(in_RDI);
  if (_Var3) {
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_DL];
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_DL];
    for (local_1c = 0; local_1c < (int)((uint)bVar1 * (uint)bVar2); local_1c = local_1c + 1) {
      *(undefined4 *)(in_RSI + (long)local_1c * 0x10 + 8) = 0xffffffff;
      *(undefined8 *)(in_RSI + (long)local_1c * 0x10) = 0xbff0000000000000;
    }
  }
  return;
}

Assistant:

static inline void init_src_var_info_of_4x4_sub_blocks(
    const AV1_COMP *const cpi, Block4x4VarInfo *src_var_info_of_4x4_sub_blocks,
    const BLOCK_SIZE sb_size) {
  if (!is_src_var_for_4x4_sub_blocks_caching_enabled(cpi)) return;

  const int mi_count_in_sb = mi_size_wide[sb_size] * mi_size_high[sb_size];
  for (int i = 0; i < mi_count_in_sb; i++) {
    src_var_info_of_4x4_sub_blocks[i].var = -1;
    src_var_info_of_4x4_sub_blocks[i].log_var = -1.0;
  }
}